

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONParser.cpp
# Opt level: O1

Var __thiscall JSON::JSONParser::ParseObject(JSONParser *this)

{
  charcount_t len;
  PropertyId propertyId;
  char16_t *string;
  Type *pTVar1;
  JsonTypeCacheList *this_00;
  PropertyRecord *this_01;
  DynamicType *type;
  DynamicTypeHandler *newTypeHandler;
  Type *pTVar2;
  double dVar3;
  Type TVar4;
  undefined2 uVar5;
  IRecyclerVisitedObject IVar6;
  bool bVar7;
  uint uVar8;
  tokens tVar9;
  int iVar10;
  BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  JavascriptArray *pJVar11;
  RecyclableObject *obj;
  Var pvVar12;
  JSONScanner *this_03;
  ulong uVar13;
  undefined1 local_a0 [8];
  PropertyValueInfo info;
  PropertyRecord *local_48;
  IRecyclerVisitedObject local_40;
  PropertyRecord *propertyRecord;
  JsonTypeCache *currentCache;
  
  ThreadContext::ProbeStack(this->scriptContext->threadContext,0xc00,this->scriptContext,(PVOID)0x0)
  ;
  tVar9 = (this->m_token).tk;
  if (0x76 < (int)tVar9) {
    if ((int)tVar9 < 0x8c) {
      if (tVar9 == tkSub) {
        tVar9 = JSONScanner::Scan(&this->m_scanner);
        if (tVar9 != tkFltCon) {
          JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9ea);
        }
        dVar3 = Token::GetDouble((Token *)this);
        pJVar11 = (JavascriptArray *)Js::JavascriptNumber::ToVarIntCheck(-dVar3,this->scriptContext)
        ;
LAB_00b70276:
        JSONScanner::Scan(&this->m_scanner);
        return pJVar11;
      }
      if (tVar9 == tkLBrack) {
        uVar13 = 0;
        pJVar11 = Js::JavascriptLibrary::CreateArray
                            ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,0);
        this_03 = &this->m_scanner;
        JSONScanner::Scan(this_03);
        while ((this->m_token).tk != tkRBrack) {
          pvVar12 = ParseObject(this);
          (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (pJVar11,uVar13,pvVar12,0);
          if ((this->m_token).tk != tkComma) break;
          JSONScanner::Scan(this_03);
          if ((this->m_token).tk == tkRBrack) goto LAB_00b702a8;
          uVar13 = (ulong)((int)uVar13 + 1);
        }
        if ((this->m_token).tk == tkRBrack) {
          JSONScanner::Scan(this_03);
          return pJVar11;
        }
        JSONScanner::ThrowSyntaxError(this_03,-0x7ff5e9ec);
      }
    }
    else {
      if (tVar9 == tkStrCon) {
        pJVar11 = (JavascriptArray *)
                  Js::JavascriptString::NewCopyBuffer
                            ((this->m_scanner).currentString,(this->m_scanner).currentIndex,
                             this->scriptContext);
        goto LAB_00b70276;
      }
      if (tVar9 == tkFltCon) {
        dVar3 = Token::GetDouble((Token *)this);
        pJVar11 = (JavascriptArray *)Js::JavascriptNumber::ToVarIntCheck(dVar3,this->scriptContext);
        JSONScanner::Scan(&this->m_scanner);
        return pJVar11;
      }
    }
LAB_00b702b2:
    JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9ee);
  }
  if ((int)tVar9 < 0x32) {
    if (tVar9 == tkFALSE) {
      pJVar11 = (JavascriptArray *)
                (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).booleanFalse.ptr;
    }
    else {
      if (tVar9 != tkNULL) goto LAB_00b702b2;
      pJVar11 = (JavascriptArray *)
                (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).nullValue.ptr;
    }
  }
  else {
    if (tVar9 != tkTRUE) {
      if (tVar9 != tkLCurly) goto LAB_00b702b2;
      if ((this->arenaAllocator != (ArenaAllocator *)0x0) &&
         (this->typeCacheList == (JsonTypeCacheList *)0x0)) {
        this_02 = (BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)new<Memory::ArenaAllocator>(0x38,this->arenaAllocator,0x366bee);
        JsUtil::
        BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::BaseDictionary(this_02,this->arenaAllocator,8);
        this->typeCacheList = this_02;
      }
      pJVar11 = (JavascriptArray *)
                Js::JavascriptLibrary::CreateObject
                          ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,false,0)
      ;
      bVar7 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,autoProxyFlag);
      if (bVar7) {
        obj = Js::JavascriptProxy::AutoProxyWrapper(pJVar11);
        pJVar11 = (JavascriptArray *)Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
      }
      this_03 = &this->m_scanner;
      JSONScanner::Scan(this_03);
      if ((this->m_token).tk != tkRCurly) {
        propertyRecord = (PropertyRecord *)0x0;
        local_48 = (PropertyRecord *)0x0;
        info._56_8_ = this_03;
        do {
          if ((this->m_token).tk != tkStrCon) {
LAB_00b702a8:
            JSONScanner::ThrowSyntaxError(this_03,-0x7ff5e9e9);
          }
          string = (this->m_scanner).currentString;
          len = (this->m_scanner).currentIndex;
          pTVar1 = (pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr;
          if (this->arenaAllocator == (ArenaAllocator *)0x0) {
LAB_00b6ffa8:
            Js::ScriptContext::GetOrAddPropertyRecord
                      (this->scriptContext,string,len,(PropertyRecord **)&local_40);
            tVar9 = JSONScanner::Scan(this_03);
            if (tVar9 != tkColon) {
LAB_00b7029b:
              JSONScanner::ThrowSyntaxError(this_03,-0x7ff5e9ed);
            }
            JSONScanner::Scan(this_03);
            pvVar12 = ParseObject(this);
            local_a0 = (undefined1  [8])0x0;
            info.m_instance = (RecyclableObject *)0x50000ffff;
            info.prop = (RecyclableObject *)0x0;
            info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
            info.functionBody = (FunctionBody *)0x0;
            info.m_propertyIndex = 0;
            info.m_attributes = '\0';
            info.flags = InlineCacheNoFlags;
            info.cacheInfoFlag = 0;
            info.inlineCache = (InlineCache *)0x0;
            info.propertyRecordUsageCache._0_4_ = 0xffffffff;
            info.propertyRecordUsageCache._5_1_ = 1;
            (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x17])(pJVar11,(ulong)*(uint *)(local_40._vptr_IRecyclerVisitedObject + 1),pvVar12,0,
                      local_a0);
            if ((((this->arenaAllocator != (ArenaAllocator *)0x0) &&
                 (*(code *)(local_40._vptr_IRecyclerVisitedObject + 2) == (code)0x0)) &&
                ((pTVar2 = (pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                           type.ptr, local_a0 == (undefined1  [8])0x0 ||
                 ((short)info.m_instance != -1)))) &&
               ((*(char *)((long)&pTVar2[1].javascriptLibrary.ptr + 1) == '\x01' &&
                (iVar10 = (**(code **)(**(long **)(pTVar2 + 1) + 0x270))(),
                IVar6._vptr_IRecyclerVisitedObject = local_40._vptr_IRecyclerVisitedObject,
                iVar10 != 0)))) {
              uVar5 = (short)info.m_instance;
              if (local_48 == (PropertyRecord *)0x0) {
                propertyRecord =
                     (PropertyRecord *)
                     new<Memory::ArenaAllocator>(0x28,this->arenaAllocator,0x366bee);
                (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject = IVar6._vptr_IRecyclerVisitedObject;
                *(Type **)&propertyRecord->pid = pTVar1;
                *(Type **)&propertyRecord->isNumeric = pTVar2;
                propertyRecord[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject = (_func_int **)0x0;
                *(undefined2 *)&propertyRecord[1].pid = uVar5;
                JsUtil::
                BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::
                Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                          ((BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                            *)this->typeCacheList,(PropertyRecord **)&local_40,
                           (JsonTypeCache **)&propertyRecord);
              }
              else if (propertyRecord == (PropertyRecord *)0x0) {
                propertyRecord =
                     (PropertyRecord *)
                     new<Memory::ArenaAllocator>(0x28,this->arenaAllocator,0x366bee);
                (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject = IVar6._vptr_IRecyclerVisitedObject;
                *(Type **)&propertyRecord->pid = pTVar1;
                *(Type **)&propertyRecord->isNumeric = pTVar2;
                propertyRecord[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject = (_func_int **)0x0;
                *(undefined2 *)&propertyRecord[1].pid = uVar5;
                local_48[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject = (_func_int **)propertyRecord;
              }
              else {
                (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject = local_40._vptr_IRecyclerVisitedObject;
                *(Type **)&propertyRecord->pid = pTVar1;
                *(Type **)&propertyRecord->isNumeric = pTVar2;
                *(short *)&propertyRecord[1].pid = (short)info.m_instance;
              }
              local_48 = propertyRecord;
              propertyRecord =
                   (PropertyRecord *)
                   propertyRecord[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject;
            }
            bVar7 = (this->m_token).tk != tkComma;
            if (!bVar7) {
              JSONScanner::Scan(this_03);
            }
          }
          else {
            if (local_48 == (PropertyRecord *)0x0) {
              this_00 = this->typeCacheList;
              Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer
                        ((HashedCharacterBuffer<char16_t> *)local_a0,string,len);
              uVar8 = JsUtil::
                      BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      ::FindEntryWithKey<Js::HashedCharacterBuffer<char16_t>>
                                ((BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                  *)this_00,(HashedCharacterBuffer<char16_t> *)local_a0);
              if ((int)uVar8 < 0) {
                propertyRecord = (PropertyRecord *)0x0;
              }
              else {
                propertyRecord =
                     (PropertyRecord *)
                     this_00->entries[uVar8].
                     super_DefaultHashedEntry<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*>.
                     super_ValueEntry<JSON::JsonTypeCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*>_>
                     .
                     super_KeyValueEntryDataLayout2<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*>
                     .value;
              }
            }
            if ((propertyRecord == (PropertyRecord *)0x0) ||
               (*(Type **)&propertyRecord->pid != pTVar1)) goto LAB_00b6ffa8;
            this_01 = (PropertyRecord *)
                      (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject;
            Memory::Recycler::WBSetBit(local_a0);
            local_a0 = (undefined1  [8])string;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(local_a0);
            info.m_instance = (RecyclableObject *)CONCAT44(info.m_instance._4_4_,len);
            bVar7 = Js::PropertyRecord::Equals(this_01,(CharacterBuffer<char16_t> *)local_a0);
            if (!bVar7) goto LAB_00b6ffa8;
            tVar9 = JSONScanner::Scan(this_03);
            if (tVar9 != tkColon) goto LAB_00b7029b;
            JSONScanner::Scan(this_03);
            type = *(DynamicType **)&propertyRecord->isNumeric;
            propertyId = *(PropertyId *)
                          ((propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                           _vptr_IRecyclerVisitedObject + 1);
            TVar4 = propertyRecord[1].pid;
            local_48 = propertyRecord;
            propertyRecord =
                 (PropertyRecord *)
                 propertyRecord[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject;
            newTypeHandler = (type->typeHandler).ptr;
            Js::DynamicObject::EnsureSlots
                      ((DynamicObject *)pJVar11,*(int *)(*(long *)(pTVar1 + 1) + 0xc),
                       newTypeHandler->slotCapacity,this->scriptContext,newTypeHandler);
            Js::DynamicObject::ReplaceType((DynamicObject *)pJVar11,type);
            pvVar12 = ParseObject(this);
            Js::DynamicObject::SetSlot
                      ((DynamicObject *)pJVar11,propertyId,false,(uint)(ushort)TVar4,pvVar12);
            this_03 = (JSONScanner *)info._56_8_;
            bVar7 = true;
            if ((this->m_token).tk == tkComma) {
              JSONScanner::Scan((JSONScanner *)info._56_8_);
              bVar7 = false;
            }
          }
        } while (!bVar7);
        if ((this->m_token).tk != tkRCurly) {
          JSONScanner::ThrowSyntaxError(this_03,-0x7ff5e9eb);
        }
      }
      goto LAB_00b70255;
    }
    pJVar11 = (JavascriptArray *)
              (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).booleanTrue.ptr;
  }
  this_03 = &this->m_scanner;
LAB_00b70255:
  JSONScanner::Scan(this_03);
  return pJVar11;
}

Assistant:

Js::Var JSONParser::ParseObject()
    {
        PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);

        Js::Var retVal;

        switch (m_token.tk)
        {

        case tkFltCon:
            retVal = Js::JavascriptNumber::ToVarIntCheck(m_token.GetDouble(), scriptContext);
            Scan();
            return retVal;

        case tkStrCon:
            {
                // will auto-null-terminate the string (as length=len+1)
                uint len = m_scanner.GetCurrentStringLen();
                retVal = Js::JavascriptString::NewCopyBuffer(m_scanner.GetCurrentString(), len, scriptContext);
                Scan();
                return retVal;
            }

        case tkTRUE:
            retVal = scriptContext->GetLibrary()->GetTrue();
            Scan();
            return retVal;

        case tkFALSE:
            retVal = scriptContext->GetLibrary()->GetFalse();
            Scan();
            return retVal;

        case tkNULL:
            retVal = scriptContext->GetLibrary()->GetNull();
            Scan();
            return retVal;

        case tkSub:  // unary minus

            if (Scan() == tkFltCon)
            {
                retVal = Js::JavascriptNumber::ToVarIntCheck(-m_token.GetDouble(), scriptContext);
                Scan();
                return retVal;
            }
            else
            {
                m_scanner.ThrowSyntaxError(JSERR_JsonBadNumber);
            }

        case tkLBrack:
            {

                Js::JavascriptArray* arrayObj = scriptContext->GetLibrary()->CreateArray(0);

                //skip '['
                Scan();

                //iterate over the array members, get JSON objects and add them in the pArrayMemberList
                uint k = 0;
                while (true)
                {
                    if(tkRBrack == m_token.tk)
                    {
                        break;
                    }
                    Js::Var value = ParseObject();
                    arrayObj->SetItem(k++, value, Js::PropertyOperation_None);

                    // if next token is not a comma consider the end of the array member list.
                    if (tkComma != m_token.tk)
                        break;
                    Scan();
                    if(tkRBrack == m_token.tk)
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonIllegalChar);
                    }
                }
                //check and consume the ending ']'
                CheckCurrentToken(tkRBrack, JSERR_JsonNoRbrack);
                return arrayObj;

            }

        case tkLCurly:
            {

                // Parse an object, "{"name1" : ObjMember1, "name2" : ObjMember2, ...} "
                if(IsCaching())
                {
                    if(!typeCacheList)
                    {
                        typeCacheList = Anew(this->arenaAllocator, JsonTypeCacheList, this->arenaAllocator, 8);
                    }
                }

                // first, create the object
                Js::DynamicObject* object = scriptContext->GetLibrary()->CreateObject();
                JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
                if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
                {
                    object = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(object));
                }
#endif

                //next token after '{'
                Scan();

                //if empty object "{}" return;
                if(tkRCurly == m_token.tk)
                {
                    Scan();
                    return object;
                }
                JsonTypeCache* previousCache = nullptr;
                JsonTypeCache* currentCache = nullptr;
                //parse the list of members
                while(true)
                {
                    // parse a list member:  "name" : ObjMember
                    // and add it to the object.

                    //pick "name"
                    if(tkStrCon != m_token.tk)
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonIllegalChar);
                    }

                    // currentStrLength = length w/o null-termination
                    WCHAR* currentStr = m_scanner.GetCurrentString();
                    uint currentStrLength = m_scanner.GetCurrentStringLen();

                    DynamicType* typeWithoutProperty = object->GetDynamicType();
                    if(IsCaching())
                    {
                        if(!previousCache)
                        {
                            // This is the first property in the list - see if we have an existing cache for it.
                            currentCache = typeCacheList->LookupWithKey(Js::HashedCharacterBuffer<WCHAR>(currentStr, currentStrLength), nullptr);
                        }
                        if(currentCache && currentCache->typeWithoutProperty == typeWithoutProperty &&
                            currentCache->propertyRecord->Equals(JsUtil::CharacterBuffer<WCHAR>(currentStr, currentStrLength)))
                        {
                            //check and consume ":"
                            if(Scan() != tkColon )
                            {
                                m_scanner.ThrowSyntaxError(JSERR_JsonNoColon);
                            }
                            Scan();

                            // Cache all values from currentCache as there is a chance that ParseObject might change the cache
                            DynamicType* typeWithProperty = currentCache->typeWithProperty;
                            PropertyId propertyId = currentCache->propertyRecord->GetPropertyId();
                            PropertyIndex propertyIndex = currentCache->propertyIndex;
                            previousCache = currentCache;
                            currentCache = currentCache->next;

                            // fast path for type transition and property set
                            object->EnsureSlots(typeWithoutProperty->GetTypeHandler()->GetSlotCapacity(),
                                typeWithProperty->GetTypeHandler()->GetSlotCapacity(), scriptContext, typeWithProperty->GetTypeHandler());
                            object->ReplaceType(typeWithProperty);
                            Js::Var value = ParseObject();
                            object->SetSlot(SetSlotArguments(propertyId, propertyIndex, value));

                            // if the next token is not a comma consider the list of members done.
                            if (tkComma != m_token.tk)
                                break;
                            Scan();
                            continue;
                        }
                    }

                    // slow path
                    Js::PropertyRecord const * propertyRecord;
                    scriptContext->GetOrAddPropertyRecord(currentStr, currentStrLength, &propertyRecord);

                    //check and consume ":"
                    if(Scan() != tkColon )
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonNoColon);
                    }
                    Scan();
                    Js::Var value = ParseObject();
                    PropertyValueInfo info;
                    object->SetProperty(propertyRecord->GetPropertyId(), value, PropertyOperation_None, &info);

                    DynamicType* typeWithProperty = object->GetDynamicType();
                    if(IsCaching() && !propertyRecord->IsNumeric() && !info.IsNoCache() && typeWithProperty->GetIsShared() && typeWithProperty->GetTypeHandler()->IsPathTypeHandler())
                    {
                        PropertyIndex propertyIndex = info.GetPropertyIndex();

                        if(!previousCache)
                        {
                            // This is the first property in the set add it to the dictionary.
                            currentCache = JsonTypeCache::New(this->arenaAllocator, propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                            typeCacheList->AddNew(propertyRecord, currentCache);
                        }
                        else if(!currentCache)
                        {
                            currentCache = JsonTypeCache::New(this->arenaAllocator, propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                            previousCache->next = currentCache;
                        }
                        else
                        {
                            // cache miss!!
                            currentCache->Update(propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                        }
                        previousCache = currentCache;
                        currentCache = currentCache->next;
                    }

                    // if the next token is not a comma consider the list of members done.
                    if (tkComma != m_token.tk)
                        break;
                    Scan();
                }

                // check  and consume the ending '}"
                CheckCurrentToken(tkRCurly, JSERR_JsonNoRcurly);
                return object;
            }

        default:
            m_scanner.ThrowSyntaxError(JSERR_JsonSyntax);
        }
    }